

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O3

void __thiscall fasttext::Model::buildTree(Model *this,vector<long,_std::allocator<long>_> *counts)

{
  vector<fasttext::Node,_std::allocator<fasttext::Node>_> *this_00;
  uint uVar1;
  int iVar2;
  pointer pNVar3;
  pointer plVar4;
  pointer pNVar5;
  uint uVar6;
  uint uVar7;
  bool bVar8;
  long lVar9;
  ulong uVar10;
  bool bVar11;
  uint uVar12;
  long lVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  vector<bool,_std::allocator<bool>_> *pvVar17;
  vector<int,_std::allocator<int>_> path;
  int local_8c;
  undefined1 local_88 [8];
  int *piStack_80;
  _Bit_type *local_78;
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  *local_68;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *local_60;
  vector<bool,_std::allocator<bool>_> local_58;
  
  this_00 = &this->tree;
  std::vector<fasttext::Node,_std::allocator<fasttext::Node>_>::resize
            (this_00,(long)this->osz_ * 2 - 1);
  uVar1 = this->osz_;
  lVar9 = (long)(int)uVar1;
  uVar14 = uVar1 * 2 - 1;
  if (0 < lVar9) {
    pNVar3 = (this_00->super__Vector_base<fasttext::Node,_std::allocator<fasttext::Node>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar10 = 1;
    if (1 < (int)uVar14) {
      uVar10 = (ulong)uVar14;
    }
    lVar13 = 0;
    do {
      *(undefined8 *)((long)&pNVar3->parent + lVar13) = 0xffffffffffffffff;
      *(undefined4 *)((long)&pNVar3->right + lVar13) = 0xffffffff;
      *(undefined8 *)((long)&pNVar3->count + lVar13) = 1000000000000000;
      (&pNVar3->binary)[lVar13] = false;
      lVar13 = lVar13 + 0x20;
    } while (uVar10 * 0x20 != lVar13);
    if (0 < (int)uVar1) {
      plVar4 = (counts->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pNVar3 = (this_00->super__Vector_base<fasttext::Node,_std::allocator<fasttext::Node>_>).
               _M_impl.super__Vector_impl_data._M_start;
      lVar13 = 0;
      do {
        *(undefined8 *)((long)&pNVar3->count + lVar13 * 4) = *(undefined8 *)((long)plVar4 + lVar13);
        lVar13 = lVar13 + 8;
      } while (lVar9 * 8 - lVar13 != 0);
    }
  }
  if ((int)uVar1 < (int)uVar14) {
    uVar12 = uVar1 - 1;
    pNVar3 = (this_00->super__Vector_base<fasttext::Node,_std::allocator<fasttext::Node>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar15 = uVar1;
    do {
      pNVar5 = (this_00->super__Vector_base<fasttext::Node,_std::allocator<fasttext::Node>_>).
               _M_impl.super__Vector_impl_data._M_start;
      pvVar17 = &local_58;
      bVar8 = true;
      do {
        bVar11 = bVar8;
        if (((int)uVar12 < 0) || (pNVar5[(int)uVar15].count <= pNVar5[uVar12].count)) {
          uVar6 = uVar12;
          uVar7 = uVar15 + 1;
          uVar16 = uVar15;
        }
        else {
          uVar6 = uVar12 - 1;
          uVar7 = uVar15;
          uVar16 = uVar12;
        }
        uVar15 = uVar7;
        uVar12 = uVar6;
        *(uint *)&(pvVar17->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = uVar16;
        pvVar17 = (vector<bool,_std::allocator<bool>_> *)local_88;
        bVar8 = false;
      } while (bVar11);
      pNVar3[lVar9].left =
           (int)local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                ._M_start.super__Bit_iterator_base._M_p;
      lVar13 = (long)(int)local_88._0_4_;
      pNVar3[lVar9].right = local_88._0_4_;
      pNVar3[lVar9].count =
           pNVar3[lVar13].count +
           pNVar3[(int)local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p].count;
      pNVar3[(int)local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p].parent =
           (int32_t)lVar9;
      pNVar3[lVar13].parent = (int32_t)lVar9;
      pNVar3[lVar13].binary = true;
      lVar9 = lVar9 + 1;
    } while (lVar9 != (int)uVar14);
  }
  if (0 < (int)uVar1) {
    local_60 = &this->paths;
    local_68 = &this->codes;
    lVar9 = 0;
    do {
      local_88 = (undefined1  [8])0x0;
      piStack_80 = (int *)0x0;
      local_78 = (_Bit_type *)0x0;
      local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_offset = 0;
      local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
      .super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
      .super__Bit_iterator_base._M_offset = 0;
      local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_end_of_storage = (_Bit_pointer)0x0;
      iVar2 = (this_00->super__Vector_base<fasttext::Node,_std::allocator<fasttext::Node>_>)._M_impl
              .super__Vector_impl_data._M_start[lVar9].parent;
      lVar13 = lVar9;
      while (iVar2 != -1) {
        local_8c = iVar2 - this->osz_;
        if ((_Bit_type *)piStack_80 == local_78) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    ((vector<int,_std::allocator<int>_> *)local_88,(iterator)piStack_80,&local_8c);
        }
        else {
          *piStack_80 = local_8c;
          piStack_80 = piStack_80 + 1;
        }
        std::vector<bool,_std::allocator<bool>_>::push_back
                  (&local_58,
                   (this_00->super__Vector_base<fasttext::Node,_std::allocator<fasttext::Node>_>).
                   _M_impl.super__Vector_impl_data._M_start[lVar13].binary);
        pNVar3 = (this_00->super__Vector_base<fasttext::Node,_std::allocator<fasttext::Node>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        lVar13 = (long)pNVar3[lVar13].parent;
        iVar2 = pNVar3[lVar13].parent;
      }
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::push_back(local_60,(vector<int,_std::allocator<int>_> *)local_88);
      std::
      vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
      ::push_back(local_68,&local_58);
      if (local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
        operator_delete(local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
      }
      if (local_88 != (undefined1  [8])0x0) {
        operator_delete((void *)local_88);
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < this->osz_);
  }
  return;
}

Assistant:

void Model::buildTree(const std::vector<int64_t>& counts) {
  tree.resize(2 * osz_ - 1);
  for (int32_t i = 0; i < 2 * osz_ - 1; i++) {
    tree[i].parent = -1;
    tree[i].left = -1;
    tree[i].right = -1;
    tree[i].count = 1e15;
    tree[i].binary = false;
  }
  for (int32_t i = 0; i < osz_; i++) {
    tree[i].count = counts[i];
  }
  int32_t leaf = osz_ - 1;
  int32_t node = osz_;
  for (int32_t i = osz_; i < 2 * osz_ - 1; i++) {
    int32_t mini[2];
    for (int32_t j = 0; j < 2; j++) {
      if (leaf >= 0 && tree[leaf].count < tree[node].count) {
        mini[j] = leaf--;
      } else {
        mini[j] = node++;
      }
    }
    tree[i].left = mini[0];
    tree[i].right = mini[1];
    tree[i].count = tree[mini[0]].count + tree[mini[1]].count;
    tree[mini[0]].parent = i;
    tree[mini[1]].parent = i;
    tree[mini[1]].binary = true;
  }
  for (int32_t i = 0; i < osz_; i++) {
    std::vector<int32_t> path;
    std::vector<bool> code;
    int32_t j = i;
    while (tree[j].parent != -1) {
      path.push_back(tree[j].parent - osz_);
      code.push_back(tree[j].binary);
      j = tree[j].parent;
    }
    paths.push_back(path);
    codes.push_back(code);
  }
}